

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_ast_node *this_00;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  xpath_node *pxVar3;
  ulong extraout_RDX;
  ulong uVar4;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  xpath_node *it;
  xpath_node *pxVar5;
  xpath_node *it_1;
  ulong uVar6;
  size_t sVar7;
  xpath_node *pxVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  xpath_context c;
  
  pxVar8 = ns->_begin;
  pxVar3 = ns->_end;
  uVar6 = (long)pxVar3 - (long)pxVar8 >> 4;
  if (uVar6 != first) {
    if ((this->_type & 0xfeU) != 0x10) {
      __assert_fail("_type == ast_filter || _type == ast_predicate",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                    ,0x2643,
                    "void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate(xpath_node_set_raw &, size_t, const xpath_stack &, bool)"
                   );
    }
    this_00 = this->_right;
    if ((this->_test & 0xfeU) == 2) {
      sVar7 = uVar6 - first;
      if (uVar6 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                      ,0x2625,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                     );
      }
      if (this_00->_rettype != '\x02') {
        __assert_fail("expr->rettype() == xpath_type_number",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                      ,0x2626,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                     );
      }
      pxVar8 = pxVar8 + first;
      xpath_node::xpath_node(&c.n);
      c.position = 1;
      c.size = sVar7;
      dVar9 = eval_number(this_00,&c,stack);
      uVar4 = extraout_RDX;
      if ((1.0 <= dVar9) &&
         (auVar10._8_4_ = (int)(sVar7 >> 0x20), auVar10._0_8_ = sVar7, auVar10._12_4_ = 0x45300000,
         dVar9 <= (auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0))) {
        uVar4 = (long)dVar9 >> 0x3f;
        uVar6 = (long)(dVar9 - 9.223372036854776e+18) & uVar4 | (long)dVar9;
        auVar11._8_4_ = (int)(uVar6 >> 0x20);
        auVar11._0_8_ = uVar6;
        auVar11._12_4_ = 0x45300000;
        dVar13 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
        if ((dVar9 == dVar13) && (!NAN(dVar9) && !NAN(dVar13))) {
          pxVar1 = pxVar8[uVar6 - 1]._attribute._attr;
          (pxVar8->_node)._root = pxVar8[uVar6 - 1]._node._root;
          (pxVar8->_attribute)._attr = pxVar1;
          pxVar8 = pxVar8 + 1;
        }
      }
    }
    else if (this_00->_rettype == '\x02') {
      if (uVar6 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                      ,0x260b,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                     );
      }
      uVar4 = first * 0x10;
      sVar7 = 1;
      pxVar5 = pxVar8 + first;
      pxVar8 = pxVar5;
      for (; pxVar5 != pxVar3; pxVar5 = pxVar5 + 1) {
        c.n._node._root = (pxVar5->_node)._root;
        c.n._attribute._attr = (pxVar5->_attribute)._attr;
        c.position = sVar7;
        c.size = uVar6 - first;
        dVar9 = eval_number(this_00,&c,stack);
        auVar12._8_4_ = (int)(sVar7 >> 0x20);
        auVar12._0_8_ = sVar7;
        auVar12._12_4_ = 0x45300000;
        dVar13 = (auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0);
        uVar4 = extraout_RDX_00;
        if ((dVar9 == dVar13) && (!NAN(dVar9) && !NAN(dVar13))) {
          pxVar1 = (pxVar5->_attribute)._attr;
          (pxVar8->_node)._root = (pxVar5->_node)._root;
          (pxVar8->_attribute)._attr = pxVar1;
          pxVar8 = pxVar8 + 1;
          if (once) break;
        }
        sVar7 = sVar7 + 1;
        pxVar3 = ns->_end;
      }
    }
    else {
      if (uVar6 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                      ,0x25f1,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_boolean(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                     );
      }
      uVar4 = first * 0x10;
      sVar7 = 1;
      pxVar5 = pxVar8 + first;
      pxVar8 = pxVar5;
      for (; pxVar5 != pxVar3; pxVar5 = pxVar5 + 1) {
        c.n._node._root = (pxVar5->_node)._root;
        c.n._attribute._attr = (pxVar5->_attribute)._attr;
        c.position = sVar7;
        c.size = uVar6 - first;
        bVar2 = eval_boolean(this_00,&c,stack);
        uVar4 = extraout_RDX_01;
        if (bVar2) {
          pxVar1 = (pxVar5->_attribute)._attr;
          (pxVar8->_node)._root = (pxVar5->_node)._root;
          (pxVar8->_attribute)._attr = pxVar1;
          pxVar8 = pxVar8 + 1;
          if (once) break;
        }
        sVar7 = sVar7 + 1;
        pxVar3 = ns->_end;
      }
    }
    xpath_node_set_raw::truncate(ns,(char *)pxVar8,uVar4);
  }
  return;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}